

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocaleData::signPrefix(QString *__return_storage_ptr__,QLocaleData *this,bool negative,uint flags)

{
  ushort uVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,negative) == 0) {
    if ((flags & 0x10) == 0) {
      if ((flags & 8) != 0) {
        QString::QString(__return_storage_ptr__,(QChar *)0x1c5132,1);
        return __return_storage_ptr__;
      }
    }
    else {
      uVar2 = (ulong)this->m_plus_size;
      if (uVar2 != 0) {
        uVar1 = this->m_plus_idx;
        goto LAB_00158c58;
      }
    }
  }
  else {
    uVar2 = (ulong)this->m_minus_size;
    if (uVar2 != 0) {
      uVar1 = this->m_minus_idx;
LAB_00158c58:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr =
           L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
           + uVar1;
      (__return_storage_ptr__->d).size = uVar2;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::signPrefix(bool negative, unsigned flags) const
{
    if (negative)
        return negativeSign();
    if (flags & AlwaysShowSign)
        return positiveSign();
    if (flags & BlankBeforePositive)
        return QStringView(u" ").toString();
    return {};
}